

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O0

void __thiscall absl::lts_20240722::Cord::DestroyCordSlow(Cord *this)

{
  bool bVar1;
  Nullable<absl::cord_internal::CordzInfo_*> pCVar2;
  Nonnull<absl::cord_internal::CordRep_*> node;
  Nullable<CordRep_*> rep;
  Cord *this_local;
  
  bVar1 = InlineRep::is_tree(&this->contents_);
  if (!bVar1) {
    __assert_fail("contents_.is_tree()",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_abseil/build_O0/_deps/absl-src/absl/strings/cord.cc"
                  ,0x16b,"void absl::Cord::DestroyCordSlow()");
  }
  pCVar2 = InlineRep::cordz_info(&this->contents_);
  if (pCVar2 != (Nullable<absl::cord_internal::CordzInfo_*>)0x0) {
    absl::lts_20240722::cord_internal::CordzInfo::Untrack();
  }
  node = InlineRep::as_tree(&this->contents_);
  rep = VerifyTree(node);
  cord_internal::CordRep::Unref(rep);
  return;
}

Assistant:

void Cord::DestroyCordSlow() {
  assert(contents_.is_tree());
  CordzInfo::MaybeUntrackCord(contents_.cordz_info());
  CordRep::Unref(VerifyTree(contents_.as_tree()));
}